

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

void __thiscall wirehair::Codec::InsertHeavyRows(Codec *this)

{
  uint16_t uVar1;
  uint16_t uVar2;
  ushort uVar3;
  undefined2 uVar4;
  uint uVar5;
  uint uVar6;
  uint16_t *puVar7;
  uint8_t *puVar8;
  uint64_t *puVar9;
  ulong uVar10;
  ushort uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  
  uVar1 = this->_defer_count;
  uVar2 = this->_mix_count;
  uVar10 = (ulong)this->_pivot_count;
  uVar11 = uVar1 + this->_dense_count;
  uVar13 = (ulong)this->_pivot_count;
  do {
    puVar7 = this->_pivots;
    do {
      if ((int)uVar10 < 1) {
        this->_first_heavy_pivot = (uint)uVar13;
        puVar7 = this->_pivots;
        uVar14 = this->_pivot_count;
        for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
          uVar4 = this->_extra_count;
          puVar7[uVar14 + (int)lVar12] = uVar11 + (short)lVar12 + uVar4;
        }
        this->_pivot_count = uVar14 + 6;
        return;
      }
      uVar3 = puVar7[uVar10 - 1];
      uVar10 = uVar10 - 1;
    } while (uVar3 < uVar11);
    if (this->_next_pivot <= uVar10) {
      uVar13 = (ulong)((uint)uVar13 - 1);
      puVar7[uVar10] = puVar7[uVar13];
      puVar7[uVar13] = uVar3;
    }
    uVar5 = this->_ge_pitch;
    uVar6 = this->_heavy_pitch;
    puVar8 = this->_heavy_matrix;
    puVar9 = this->_ge_matrix;
    for (uVar14 = this->_first_heavy_column; uVar14 < (ushort)(uVar2 + uVar1); uVar14 = uVar14 + 1)
    {
      puVar8[(ulong)(uVar14 - this->_first_heavy_column) +
             (ulong)(((uint)uVar3 - (uint)uVar11) * uVar6)] =
           (puVar9[(ulong)(uVar3 * uVar5) + (ulong)(uVar14 >> 6)] >> ((ulong)uVar14 & 0x3f) & 1) !=
           0;
    }
  } while( true );
}

Assistant:

void Codec::InsertHeavyRows()
{
    CAT_IF_DUMP(cout << endl << "---- InsertHeavyRows ----" << endl << endl;)

    CAT_IF_DUMP(cout << "Converting remaining extra rows to heavy...";)

    // Initialize index of first heavy pivot
    unsigned first_heavy_pivot = _pivot_count;

    const uint16_t column_count = _defer_count + _mix_count;
    const uint16_t first_heavy_row = _defer_count + _dense_count;

    // For each remaining pivot in the list:
    for (int pivot_j = (int)_pivot_count - 1; pivot_j >= 0; --pivot_j)
    {
        CAT_DEBUG_ASSERT((unsigned)pivot_j < _pivot_count);
        const uint16_t ge_row_j = _pivots[pivot_j];

        // If row is extra:
        if (ge_row_j < first_heavy_row) {
            continue;
        }

        // If pivot is still unused:
        if ((unsigned)pivot_j >= _next_pivot)
        {
            CAT_DEBUG_ASSERT(first_heavy_pivot > 0);
            --first_heavy_pivot;

            // Swap pivot j into last heavy pivot position
            CAT_DEBUG_ASSERT(first_heavy_pivot < _pivot_count);
            _pivots[pivot_j] = _pivots[first_heavy_pivot];
            _pivots[first_heavy_pivot] = ge_row_j;
        }

        CAT_IF_DUMP(cout << " row=" << ge_row_j << ", pivot=" << pivot_j;)

        CAT_DEBUG_ASSERT(ge_row_j >= first_heavy_row);
        uint8_t * GF256_RESTRICT extra_row = _heavy_matrix + _heavy_pitch * (ge_row_j - first_heavy_row);
        const uint64_t * GF256_RESTRICT ge_extra_row = _ge_matrix + _ge_pitch * ge_row_j;

        // Copy heavy columns to heavy matrix row

        for (unsigned ge_column_j = _first_heavy_column; ge_column_j < column_count; ++ge_column_j)
        {
            // Find bit for this column
            const uint64_t column_bit = (ge_extra_row[ge_column_j >> 6] >> (ge_column_j & 63)) & 1;

            // Set extra row byte to 0 or 1
            CAT_DEBUG_ASSERT(ge_column_j >= _first_heavy_column);
            extra_row[ge_column_j - _first_heavy_column] = static_cast<uint8_t>(column_bit);
        }
    }

    CAT_IF_DUMP(cout << endl;)

    // Store first heavy pivot index
    _first_heavy_pivot = first_heavy_pivot;

    // Add heavy rows at the end to cause them to be selected last if given a choice
    for (uint16_t heavy_i = 0; heavy_i < kHeavyRows; ++heavy_i) {
        // Use GE row index after extra count even if not all are used yet
        _pivots[_pivot_count + heavy_i] = first_heavy_row + _extra_count + heavy_i;
    }

    _pivot_count += kHeavyRows;

    CAT_IF_DUMP(cout << "Added heavy rows to the end of the pivots list." << endl;)
}